

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O0

void __thiscall despot::BaseTag::PrintBelief(BaseTag *this)

{
  ostream *in_RDX;
  Belief *in_RSI;
  
  PrintBelief((BaseTag *)
              &this[-1].memory_pool_.freelist_.
               super__Vector_base<despot::TagState_*,_std::allocator<despot::TagState_*>_>._M_impl.
               super__Vector_impl_data._M_finish,in_RSI,in_RDX);
  return;
}

Assistant:

void BaseTag::PrintAction(ACT_TYPE action, ostream& out) const {
	switch(action) {
		case 0: out << "North" << endl; break;
		case 1: out << "East" << endl; break;
		case 2: out << "South" << endl; break;
		case 3: out << "West" << endl; break;
		case 4: out << "Tag" << endl; break;
		default: out << "Wrong action" << endl; exit(1);
	}
}